

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col)

{
  value_type *ppvVar1;
  ImTextureID user_texture_id_local;
  
  if (0xffffff < col) {
    user_texture_id_local = user_texture_id;
    if ((this->_TextureIdStack).Size != 0) {
      ppvVar1 = ImVector<void_*>::back(&this->_TextureIdStack);
      if (*ppvVar1 == user_texture_id) {
        PrimReserve(this,6,4);
        PrimRectUV(this,a,b,uv_a,uv_b,col);
        return;
      }
    }
    PushTextureID(this,&user_texture_id_local);
    PrimReserve(this,6,4);
    PrimRectUV(this,a,b,uv_a,uv_b,col);
    PopTextureID(this);
  }
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    // FIXME-OPT: This is wasting draw calls.
    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(a, b, uv_a, uv_b, col);

    if (push_texture_id)
        PopTextureID();
}